

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GradeBook.cpp
# Opt level: O2

string * __thiscall
GradeBook::getCourseName_abi_cxx11_(string *__return_storage_ptr__,GradeBook *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string GradeBook::getCourseName() { return courseName; }